

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_attack(textblock *tb,monster_race *race,monster_lore_conflict *lore,
                       bitflag *known_flags)

{
  random_value *prVar1;
  ulong uVar2;
  ulong uVar3;
  random_value v;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  monster_blow *pmVar7;
  _Bool _Var8;
  monster_sex_t sex;
  wchar_t wVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  size_t sVar13;
  random_chance rStack_64;
  wchar_t percent;
  random_chance c;
  wchar_t index;
  char *effect_str;
  random_value dice;
  monster_sex_t msex;
  wchar_t total_centidamage;
  wchar_t described_count;
  wchar_t total_attacks;
  wchar_t known_attacks;
  wchar_t i;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    sex = lore_monster_sex(race);
    _Var8 = flag_has_dbg(known_flags,0xc,0x1a,"known_flags","RF_NEVER_BLOW");
    if (_Var8) {
      pcVar12 = lore_pronoun_nominative(sex,true);
      textblock_append(tb,"%s has no physical attacks.  ",pcVar12);
    }
    else {
      total_centidamage = L'\0';
      described_count = L'\0';
      for (total_attacks = L'\0'; total_attacks < (int)(uint)z_info->mon_blows_max;
          total_attacks = total_attacks + L'\x01') {
        if ((race->blow[total_attacks].method != (blow_method_conflict *)0x0) &&
           (total_centidamage = total_centidamage + L'\x01',
           (lore->blow_known[total_attacks] & 1U) != 0)) {
          described_count = described_count + L'\x01';
        }
      }
      if (described_count == L'\0') {
        pcVar12 = lore_pronoun_possessive(sex,false);
        textblock_append_c(tb,'\x03',"Nothing is known about %s attack.  ",pcVar12);
      }
      else {
        msex = MON_SEX_NEUTER;
        dice.m_bonus = 99;
        for (total_attacks = L'\0'; total_attacks < (int)(uint)z_info->mon_blows_max;
            total_attacks = total_attacks + L'\x01') {
          stack0xffffffffffffffa8 = (char *)0x0;
          if ((race->blow[total_attacks].method != (blow_method_conflict *)0x0) &&
             ((lore->blow_known[total_attacks] & 1U) != 0)) {
            prVar1 = &race->blow[total_attacks].dice;
            uVar2._0_4_ = prVar1->base;
            uVar2._4_4_ = prVar1->dice;
            pmVar7 = race->blow + total_attacks;
            uVar3._0_4_ = (pmVar7->dice).sides;
            uVar3._4_4_ = (pmVar7->dice).m_bonus;
            uVar4 = prVar1->base;
            uVar5 = prVar1->dice;
            uVar6 = prVar1->sides;
            v.sides = uVar6;
            v.dice = uVar5;
            v.base = uVar4;
            unique0x00012000 = (race->blow[total_attacks].effect)->desc;
            if (msex == MON_SEX_NEUTER) {
              pcVar12 = lore_pronoun_nominative(sex,true);
              textblock_append(tb,"%s can ",pcVar12);
            }
            else if ((int)msex < described_count + L'\xffffffff') {
              textblock_append(tb,", ");
            }
            else {
              textblock_append(tb,", and ");
            }
            textblock_append(tb,"%s",(race->blow[total_attacks].method)->desc);
            if ((stack0xffffffffffffffa8 != (char *)0x0) &&
               (sVar13 = strlen(stack0xffffffffffffffa8), sVar13 != 0)) {
              c.numerator = blow_index((race->blow[total_attacks].effect)->name);
              textblock_append(tb," to ");
              wVar9 = blow_color(player,c.numerator);
              textblock_append_c(tb,(uint8_t)wVar9,"%s",stack0xffffffffffffffa8);
              textblock_append(tb," (");
              if (((undefined4)uVar2 != 0) ||
                 (((uVar2._4_4_ != 0 && ((undefined4)uVar3 != 0)) || (uVar3._4_4_ != 0)))) {
                if ((undefined4)uVar2 != 0) {
                  textblock_append_c(tb,'\r',"%d",uVar2 & 0xffffffff);
                }
                if ((uVar2._4_4_ != 0) && ((undefined4)uVar3 != 0)) {
                  textblock_append_c(tb,'\r',"%dd%d",(ulong)(uint)uVar2._4_4_,uVar3 & 0xffffffff);
                }
                if (uVar3._4_4_ != 0) {
                  textblock_append_c(tb,'\r',"M%d",(ulong)(uint)uVar3._4_4_);
                }
                textblock_append(tb,", ");
              }
              wVar9 = chance_of_monster_hit_base
                                (race,(blow_effect *)race->blow[total_attacks].effect);
              hit_chance(&stack0xffffffffffffff9c,wVar9,(player->state).ac + (player->state).to_a);
              uVar10 = random_chance_scaled(rStack_64,100);
              textblock_append_c(tb,'\x0e',"%d",(ulong)uVar10);
              textblock_append(tb,"%%)");
              v.m_bonus = uVar3._4_4_;
              iVar11 = randcalc(v,0,AVERAGE);
              dice.m_bonus = uVar10 * iVar11 + dice.m_bonus;
            }
            msex = msex + MON_SEX_MALE;
          }
        }
        textblock_append(tb,", averaging");
        if (described_count < total_centidamage) {
          textblock_append_c(tb,'\x03'," at least");
        }
        textblock_append_c(tb,'\r'," %d",(long)dice.m_bonus / 100 & 0xffffffff);
        pcVar12 = lore_pronoun_possessive(sex,false);
        textblock_append(tb," damage on each of %s turns.  ",pcVar12);
      }
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x667,
                "void lore_append_attack(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_attack(textblock *tb, const struct monster_race *race,
						const struct monster_lore *lore,
						bitflag known_flags[RF_SIZE])
{
	int i, known_attacks, total_attacks, described_count, total_centidamage;
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Notice lack of attacks */
	if (rf_has(known_flags, RF_NEVER_BLOW)) {
		textblock_append(tb, "%s has no physical attacks.  ",
						 lore_pronoun_nominative(msex, true));
		return;
	}

	total_attacks = 0;
	known_attacks = 0;

	/* Count the number of defined and known attacks */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		/* Skip non-attacks */
		if (!race->blow[i].method) continue;

		total_attacks++;
		if (lore->blow_known[i])
			known_attacks++;
	}

	/* Describe the lack of knowledge */
	if (known_attacks == 0) {
		textblock_append_c(tb, COLOUR_ORANGE, "Nothing is known about %s attack.  ",
						 lore_pronoun_possessive(msex, false));
		return;
	}

	described_count = 0;
	total_centidamage = 99; // round up the final result to the next higher point

	/* Describe each melee attack */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		random_value dice;
		const char *effect_str = NULL;

		/* Skip unknown and undefined attacks */
		if (!race->blow[i].method || !lore->blow_known[i]) continue;

		/* Extract the attack info */
		dice = race->blow[i].dice;
		effect_str = race->blow[i].effect->desc;

		/* Introduce the attack description */
		if (described_count == 0)
			textblock_append(tb, "%s can ",
							 lore_pronoun_nominative(msex, true));
		else if (described_count < known_attacks - 1)
			textblock_append(tb, ", ");
		else
			textblock_append(tb, ", and ");

		/* Describe the method */
		textblock_append(tb, "%s", race->blow[i].method->desc);

		/* Describe the effect (if any) */
		if (effect_str && strlen(effect_str) > 0) {
			int index = blow_index(race->blow[i].effect->name);
			/* Describe the attack type */
			textblock_append(tb, " to ");
			textblock_append_c(tb, blow_color(player, index), "%s", effect_str);

			textblock_append(tb, " (");
			/* Describe damage (if known) */
			if (dice.base || (dice.dice && dice.sides) || dice.m_bonus) {
				if (dice.base)
					textblock_append_c(tb, COLOUR_L_GREEN, "%d", dice.base);

				if (dice.dice && dice.sides)
					textblock_append_c(tb, COLOUR_L_GREEN, "%dd%d", dice.dice, dice.sides);

				if (dice.m_bonus)
					textblock_append_c(tb, COLOUR_L_GREEN, "M%d", dice.m_bonus);

				textblock_append(tb, ", ");
			}

			/* Describe hit chances */
			random_chance c;
			hit_chance(&c, chance_of_monster_hit_base(race, race->blow[i].effect),
				player->state.ac + player->state.to_a);
			int percent = random_chance_scaled(c, 100);
			textblock_append_c(tb, COLOUR_L_BLUE, "%d", percent);
			textblock_append(tb, "%%)");

			total_centidamage += (percent * randcalc(dice, 0, AVERAGE));
		}

		described_count++;
	}

	textblock_append(tb, ", averaging");
	if (known_attacks < total_attacks) {
		textblock_append_c(tb, COLOUR_ORANGE, " at least");
	}
	textblock_append_c(tb, COLOUR_L_GREEN, " %d", total_centidamage/100);
	textblock_append(tb, " damage on each of %s turns.  ",
					 lore_pronoun_possessive(msex, false));
}